

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Minisat::Solver::garbageCollect(Solver *this)

{
  ClauseAllocator to;
  ClauseAllocator local_28;
  
  ClauseAllocator::ClauseAllocator
            (&local_28,
             (this->ca).super_RegionAllocator<unsigned_int>.sz -
             (this->ca).super_RegionAllocator<unsigned_int>.wasted_);
  relocAll(this,&local_28);
  if (1 < this->verbosity) {
    printf("c |  Garbage collection:   %12d bytes => %12d bytes             |\n",
           (ulong)((this->ca).super_RegionAllocator<unsigned_int>.sz << 2),
           (ulong)(local_28.super_RegionAllocator<unsigned_int>.sz << 2));
  }
  ClauseAllocator::moveTo(&local_28,&this->ca);
  free(local_28.super_RegionAllocator<unsigned_int>.memory);
  return;
}

Assistant:

void Solver::garbageCollect()
{
    // Initialize the next region to a size corresponding to the estimated utilization degree. This
    // is not precise but should avoid some unnecessary reallocations for the new region:
    ClauseAllocator to(ca.size() - ca.wasted());

    relocAll(to);
    if (verbosity >= 2)
        printf("c |  Garbage collection:   %12d bytes => %12d bytes             |\n",
               ca.size() * ClauseAllocator::Unit_Size, to.size() * ClauseAllocator::Unit_Size);
    to.moveTo(ca);
}